

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

bool __thiscall
dgClusterList::IsClusterCoplanar(dgClusterList *this,dgBigPlane *plane,dgMeshEffect *mesh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  dgBigVector *pdVar4;
  dgEdge *pdVar5;
  dgListNode *pdVar6;
  dgEdge *pdVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  pdVar6 = (this->super_dgList<dgClusterFace>).m_first;
  bVar8 = pdVar6 == (dgListNode *)0x0;
  if (!bVar8) {
    pdVar4 = mesh->m_points;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (plane->super_dgBigVector).super_dgTemplateVector<double>.m_x;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (plane->super_dgBigVector).super_dgTemplateVector<double>.m_z;
    auVar11._8_8_ = 0x7fffffffffffffff;
    auVar11._0_8_ = 0x7fffffffffffffff;
    do {
      pdVar5 = (pdVar6->m_info).m_edge;
      pdVar7 = pdVar5;
      do {
        iVar3 = pdVar7->m_incidentVertex;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = pdVar4[iVar3].super_dgTemplateVector<double>.m_x;
        auVar12._8_8_ = 0;
        auVar12._0_8_ =
             (plane->super_dgBigVector).super_dgTemplateVector<double>.m_y *
             pdVar4[iVar3].super_dgTemplateVector<double>.m_y;
        auVar1 = vfmadd231sd_fma(auVar12,auVar9,auVar1);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pdVar4[iVar3].super_dgTemplateVector<double>.m_z;
        auVar1 = vfmadd231sd_fma(auVar1,auVar10,auVar2);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = auVar1._0_8_ + (plane->super_dgBigVector).super_dgTemplateVector<double>.m_w
        ;
        auVar1 = vandpd_avx(auVar13,auVar11);
        if (9.999999747378752e-06 < auVar1._0_8_) {
          return bVar8;
        }
        pdVar7 = pdVar7->m_next;
      } while (pdVar7 != pdVar5);
      pdVar6 = pdVar6->m_next;
      bVar8 = pdVar6 == (dgListNode *)0x0;
    } while (!bVar8);
  }
  return bVar8;
}

Assistant:

bool IsClusterCoplanar(const dgBigPlane& plane,
		  const dgMeshEffect& mesh) const
	  {
		  const dgBigVector* const points = (dgBigVector*) mesh.GetVertexPool();
		  for (dgListNode* node = GetFirst(); node; node = node->GetNext()) {
			  dgClusterFace& info = node->GetInfo();

			  dgEdge* ptr = info.m_edge;
			  do {
				  const dgBigVector& p = points[ptr->m_incidentVertex];
				  hacd::HaF64 dist = fabs(plane.Evalue(p));
				  if (dist > hacd::HaF64(1.0e-5f)) {
					  return false;
				  }
				  ptr = ptr->m_next;
			  } while (ptr != info.m_edge);
		  }

		  return true;
	  }